

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteStandard<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::UnaryOperatorWrapper,duckdb::NegateOperator>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  VectorType VVar1;
  bool bVar2;
  VectorType VVar3;
  idx_t iVar4;
  hugeint_t *this;
  void *in_RCX;
  ValidityMask *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  undefined4 in_R8D;
  char in_R9B;
  uint uVar5;
  hugeint_t hVar6;
  hugeint_t *ldata_3;
  hugeint_t *result_data_3;
  UnifiedVectorFormat vdata;
  SelectionVector *offsets;
  hugeint_t *ldata_2;
  hugeint_t *result_data_2;
  Vector *dictionary_values;
  optional_idx dict_size;
  hugeint_t *ldata_1;
  hugeint_t *result_data_1;
  hugeint_t *ldata;
  hugeint_t *result_data;
  Vector *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  SelectionVector *in_stack_fffffffffffffe58;
  UnifiedVectorFormat *in_stack_fffffffffffffe60;
  Vector *in_stack_fffffffffffffe68;
  Vector *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  VectorType vector_type_p;
  Vector *in_stack_fffffffffffffe80;
  optional_idx *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  Vector *in_stack_fffffffffffffea0;
  ValidityMask *in_stack_fffffffffffffea8;
  ValidityMask *in_stack_fffffffffffffeb0;
  SelectionVector *in_stack_fffffffffffffeb8;
  idx_t in_stack_fffffffffffffec0;
  hugeint_t *in_stack_fffffffffffffec8;
  hugeint_t *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffee0;
  undefined1 uVar7;
  undefined7 in_stack_ffffffffffffff00;
  hugeint_t *in_stack_ffffffffffffff08;
  UnifiedVectorFormat *in_stack_ffffffffffffff10;
  idx_t in_stack_ffffffffffffff18;
  Vector *in_stack_ffffffffffffff20;
  UnifiedVectorFormat local_d8;
  SelectionVector *local_90;
  hugeint_t *local_88;
  hugeint_t *local_80;
  Vector *local_78;
  optional_idx local_70;
  hugeint_t *local_68;
  hugeint_t *local_60;
  uint64_t local_58;
  int64_t local_50;
  uint64_t local_48;
  int64_t local_40;
  hugeint_t *local_38;
  hugeint_t *local_30;
  char local_22;
  byte local_21;
  ValidityMask *local_18;
  Vector *local_10;
  
  vector_type_p = (VectorType)((ulong)in_stack_fffffffffffffe78 >> 0x38);
  uVar7 = (undefined1)((ulong)in_stack_fffffffffffffe98 >> 0x38);
  local_21 = (byte)in_R8D & 1;
  local_22 = in_R9B;
  local_18 = in_RDX;
  local_10 = in_RSI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(in_stack_fffffffffffffe80,vector_type_p);
    uVar7 = (undefined1)((uint)in_R8D >> 0x18);
    local_60 = FlatVector::GetData<duckdb::hugeint_t>((Vector *)0x12b1a2c);
    local_68 = FlatVector::GetData<duckdb::hugeint_t>((Vector *)0x12b1a41);
    FlatVector::Validity((Vector *)0x12b1a83);
    FlatVector::Validity((Vector *)0x12b1a98);
    ExecuteFlat<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::UnaryOperatorWrapper,duckdb::NegateOperator>
              ((hugeint_t *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               CONCAT17(VVar1,in_stack_ffffffffffffff00),(ValidityMask *)in_RSI,in_RDX,in_RCX,
               (bool)uVar7);
  }
  else if (VVar1 == CONSTANT_VECTOR) {
    Vector::SetVectorType(in_stack_fffffffffffffe80,vector_type_p);
    local_30 = ConstantVector::GetData<duckdb::hugeint_t>((Vector *)0x12b1936);
    local_38 = ConstantVector::GetData<duckdb::hugeint_t>((Vector *)0x12b194b);
    bVar2 = ConstantVector::IsNull((Vector *)0x12b1960);
    if (bVar2) {
      ConstantVector::SetNull(in_stack_fffffffffffffea0,(bool)uVar7);
    }
    else {
      ConstantVector::SetNull(in_stack_fffffffffffffea0,(bool)uVar7);
      local_58 = local_38->lower;
      local_50 = local_38->upper;
      ConstantVector::Validity(local_10);
      hVar6.upper = (int64_t)in_stack_fffffffffffffe70;
      hVar6.lower = (uint64_t)in_stack_fffffffffffffe68;
      hVar6 = UnaryOperatorWrapper::
              Operation<duckdb::NegateOperator,duckdb::hugeint_t,duckdb::hugeint_t>
                        (hVar6,(ValidityMask *)in_stack_fffffffffffffe60,
                         (idx_t)in_stack_fffffffffffffe58,
                         (void *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      local_48 = hVar6.lower;
      local_30->lower = local_48;
      local_40 = hVar6.upper;
      local_30->upper = local_40;
    }
  }
  else {
    if ((VVar1 == DICTIONARY_VECTOR) && (local_22 == '\0')) {
      local_70 = DictionaryVector::DictionarySize(in_stack_fffffffffffffe48);
      bVar2 = optional_idx::IsValid(&local_70);
      if ((bVar2) &&
         (iVar4 = optional_idx::GetIndex(in_stack_fffffffffffffe90),
         (ValidityMask *)(iVar4 * 2) < local_18 || (long)(iVar4 * 2) - (long)local_18 == 0)) {
        local_78 = DictionaryVector::Child((Vector *)0x12b1b3d);
        VVar3 = Vector::GetVectorType(local_78);
        if (VVar3 == FLAT_VECTOR) {
          local_80 = FlatVector::GetData<duckdb::hugeint_t>((Vector *)0x12b1b67);
          uVar7 = (undefined1)((uint)in_R8D >> 0x18);
          this = FlatVector::GetData<duckdb::hugeint_t>((Vector *)0x12b1b7c);
          local_88 = this;
          optional_idx::GetIndex((optional_idx *)this);
          FlatVector::Validity((Vector *)0x12b1bbd);
          FlatVector::Validity((Vector *)0x12b1bcf);
          ExecuteFlat<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::UnaryOperatorWrapper,duckdb::NegateOperator>
                    ((hugeint_t *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                     CONCAT17(VVar1,in_stack_ffffffffffffff00),(ValidityMask *)in_RSI,in_RDX,in_RCX,
                     (bool)uVar7);
          local_90 = DictionaryVector::SelVector((Vector *)0x12b1c0f);
          optional_idx::GetIndex((optional_idx *)this);
          Vector::Dictionary(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                             (idx_t)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          return;
        }
      }
    }
    uVar7 = (undefined1)((ulong)in_stack_fffffffffffffea0 >> 0x38);
    UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffe60);
    Vector::ToUnifiedFormat
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    Vector::SetVectorType(in_stack_fffffffffffffe80,vector_type_p);
    FlatVector::GetData<duckdb::hugeint_t>((Vector *)0x12b1cb7);
    UnifiedVectorFormat::GetData<duckdb::hugeint_t>(&local_d8);
    FlatVector::Validity((Vector *)0x12b1d22);
    uVar5 = local_21 & 1;
    ExecuteLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::UnaryOperatorWrapper,duckdb::NegateOperator>
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (void *)CONCAT44(in_R8D,in_stack_fffffffffffffee0),(bool)uVar7);
    UnifiedVectorFormat::~UnifiedVectorFormat
              ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffe54,uVar5));
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}